

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<FBX::Process_*> __l;
  bool bVar1;
  Process *this;
  pointer this_00;
  __shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar2;
  element_type *peVar3;
  size_type sVar4;
  runtime_error *this_02;
  ostream *poVar5;
  rep rVar6;
  duration<long,_std::ratio<1L,_1000000000L>_> local_118;
  duration<long,_std::ratio<1L,_1000L>_> local_110;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_108;
  time_point t2;
  string local_f8;
  reference local_d8;
  Face *face;
  iterator __end1;
  iterator __begin1;
  vector<FBX::Face,_std::allocator<FBX::Face>_> *__range1;
  Process *local_b0;
  iterator local_a8;
  size_type local_a0;
  set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_> local_98;
  allocator<char> local_51;
  string local_50;
  unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_> local_30;
  unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_> *local_28;
  unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_> *result;
  time_point t1;
  char **argv_local;
  int argc_local;
  
  t1.__d.__r = (duration)(duration)argv;
  result = (unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_> *)
           std::chrono::_V2::system_clock::now();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Fox.fbx",&local_51);
  this = (Process *)operator_new(8);
  ((Process *)&this->_vptr_Process)->_vptr_Process = (_func_int **)0x0;
  FBX::TriangulateProcess::TriangulateProcess((TriangulateProcess *)this);
  local_a8 = &local_b0;
  local_a0 = 1;
  local_b0 = this;
  std::allocator<FBX::Process_*>::allocator((allocator<FBX::Process_*> *)((long)&__range1 + 6));
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  std::set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>::set
            (&local_98,__l,(less<FBX::Process_*> *)((long)&__range1 + 7),
             (allocator<FBX::Process_*> *)((long)&__range1 + 6));
  FBX::importFile((FBX *)&local_30,&local_50,&local_98);
  std::set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>::~set
            (&local_98);
  std::allocator<FBX::Process_*>::~allocator((allocator<FBX::Process_*> *)((long)&__range1 + 6));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_28 = &local_30;
  this_00 = std::unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_>::operator->
                      (local_28);
  this_01 = (__shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
            ::operator[](&this_00->models,0);
  peVar2 = std::__shared_ptr_access<FBX::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this_01);
  peVar3 = std::__shared_ptr_access<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &peVar2->mesh);
  __end1 = std::vector<FBX::Face,_std::allocator<FBX::Face>_>::begin(&peVar3->faces);
  face = (Face *)std::vector<FBX::Face,_std::allocator<FBX::Face>_>::end(&peVar3->faces);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<FBX::Face_*,_std::vector<FBX::Face,_std::allocator<FBX::Face>_>_>
                                *)&face);
    if (!bVar1) {
      local_108.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      poVar5 = std::operator<<((ostream *)&std::cout,"Took ");
      local_118.__r =
           (rep)std::chrono::operator-
                          (&local_108,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&result);
      local_110.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&local_118);
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_110);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar6);
      poVar5 = std::operator<<(poVar5," milliseconds to read file");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_>::~unique_ptr
                (&local_30);
      return 0;
    }
    local_d8 = __gnu_cxx::
               __normal_iterator<FBX::Face_*,_std::vector<FBX::Face,_std::allocator<FBX::Face>_>_>::
               operator*(&__end1);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_d8->indices);
    if (sVar4 != 3) break;
    __gnu_cxx::__normal_iterator<FBX::Face_*,_std::vector<FBX::Face,_std::allocator<FBX::Face>_>_>::
    operator++(&__end1);
  }
  t2.__d.__r._7_1_ = 1;
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_d8->indices);
  std::__cxx11::to_string(&local_f8,sVar4);
  std::runtime_error::runtime_error(this_02,(string *)&local_f8);
  t2.__d.__r._7_1_ = 0;
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char *argv[]) {
    auto t1 = std::chrono::high_resolution_clock::now();

    const auto &result = FBX::importFile("Fox.fbx", std::set<FBX::Process*>{new FBX::TriangulateProcess()});

    for (const auto &face : result->models[0]->mesh->faces)
        if (face.indices.size() != 3)
            throw std::runtime_error(std::to_string(face.indices.size()));

    auto t2 = std::chrono::high_resolution_clock::now();
    std::cout << "Took " << std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count()
              << " milliseconds to read file" << std::endl;

    // Use the mesh

    return EXIT_SUCCESS;
}